

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_c.cpp
# Opt level: O0

void __thiscall
MockFailureReporterForInCOnlyCode::failTest
          (MockFailureReporterForInCOnlyCode *this,MockFailure *failure)

{
  MockFailure *pMVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  undefined4 extraout_var_00;
  MockFailureReporterTestTerminatorForInCOnlyCode local_28;
  MockFailure *local_18;
  MockFailure *failure_local;
  MockFailureReporterForInCOnlyCode *this_local;
  
  local_18 = failure;
  failure_local = (MockFailure *)this;
  iVar2 = (*(this->super_MockFailureReporter)._vptr_MockFailureReporter[3])();
  uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x38))();
  if ((uVar3 & 1) == 0) {
    iVar2 = (*(this->super_MockFailureReporter)._vptr_MockFailureReporter[3])();
    pMVar1 = local_18;
    MockFailureReporterTestTerminatorForInCOnlyCode::MockFailureReporterTestTerminatorForInCOnlyCode
              (&local_28,(bool)((this->super_MockFailureReporter).crashOnFailure_ & 1));
    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x138))
              ((long *)CONCAT44(extraout_var_00,iVar2),pMVar1,&local_28);
    MockFailureReporterTestTerminatorForInCOnlyCode::
    ~MockFailureReporterTestTerminatorForInCOnlyCode(&local_28);
  }
  return;
}

Assistant:

void failTest(const MockFailure& failure) _override
    {
        if (!getTestToFail()->hasFailed())
            getTestToFail()->failWith(failure, MockFailureReporterTestTerminatorForInCOnlyCode(crashOnFailure_));
    }